

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

Log * __thiscall HttpClient::GetFullLog(Log *__return_storage_ptr__,HttpClient *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_logText)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_logText).field_2;
  pcVar1 = (this->_log)._logText._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->_log)._logText._M_string_length
            );
  __return_storage_ptr__->_printFunction = (this->_log)._printFunction;
  return __return_storage_ptr__;
}

Assistant:

Log HttpClient::GetFullLog() {
  return _log;
}